

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaCorot_8::GetStateBlock(ChElementHexaCorot_8 *this,ChVectorDynamic<> *mD)

{
  void *__dest;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long *plVar4;
  double *pdVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVector<double> v;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  double local_38;
  
  iVar6 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar6);
  lVar8 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar8 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar8 != 0) {
    memset((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar8 << 3);
  }
  iVar6 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[3])(this);
  if (0 < iVar6) {
    lVar8 = 0;
    lVar12 = 0;
    uVar13 = 0;
    lVar9 = 0;
    do {
      plVar4 = *(long **)((long)&(((this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar8);
      dVar1 = (double)plVar4[5];
      auVar15._8_8_ = plVar4[4];
      auVar15._0_8_ = plVar4[4];
      auVar16._8_8_ = plVar4[6];
      auVar16._0_8_ = plVar4[6];
      auVar14._0_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
      auVar14._8_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
      auVar17 = vfmadd231sd_fma(auVar17,auVar15,auVar2);
      auVar2 = vfmadd231pd_fma(auVar14,auVar15,
                               *(undefined1 (*) [16])
                                (this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar3 = vfmadd231sd_fma(auVar17,auVar16,auVar3);
      local_58 = vfmadd231pd_fma(auVar2,auVar16,
                                 *(undefined1 (*) [16])
                                  ((this->super_ChElementCorotational).A.
                                   super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 6));
      (**(code **)(*plVar4 + 0x60))(local_48);
      local_78 = vsubpd_avx(local_58,local_48);
      local_68 = auVar3._0_8_ - local_38;
      if ((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
          < lVar12) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar5 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar10 = 3;
      __dest = (void *)((long)pdVar5 + uVar13);
      if (((ulong)__dest & 7) == 0) {
        uVar7 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
        if (uVar7 < 3) {
          uVar10 = uVar7;
        }
        if (uVar7 != 0) goto LAB_006ae74c;
      }
      else {
LAB_006ae74c:
        memcpy(__dest,local_78,(ulong)(uVar10 * 8));
      }
      if (uVar10 < 3) {
        uVar11 = (ulong)(uVar10 << 3);
        memcpy((void *)((long)pdVar5 + uVar11 + (uVar13 & 0x7fffffff8)),local_78 + uVar11,
               0x18 - uVar11);
      }
      lVar9 = lVar9 + 1;
      iVar6 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[3])(this);
      uVar13 = uVar13 + 0x18;
      lVar12 = lVar12 + 3;
      lVar8 = lVar8 + 0x10;
    } while (lVar9 < iVar6);
  }
  return;
}

Assistant:

void ChElementHexaCorot_8::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.setZero(this->GetNdofs());

    for (int i = 0; i < GetNnodes(); i++)
        mD.segment(i * 3, 3) = (A.transpose() * this->nodes[i]->GetPos() - nodes[i]->GetX0()).eigen();
}